

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O3

void __thiscall
chrono::ChClassRegistration<chrono::ChFunctionPosition_setpoint>::~ChClassRegistration
          (ChClassRegistration<chrono::ChFunctionPosition_setpoint> *this)

{
  ~ChClassRegistration(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~ChClassRegistration() {

        // register in global class factory
        ChClassFactory::ClassUnregister(this->m_sTagName);
    }